

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void updateWindowMode(_GLFWwindow *window)

{
  long a;
  long in_stack_ffffffffffffff68;
  undefined8 local_90;
  XSetWindowAttributes attributes;
  
  if (window->monitor == (_GLFWmonitor *)0x0) {
    if (_glfw.x11.NET_WM_FULLSCREEN_MONITORS != 0 && _glfw.x11.xinerama.available != 0) {
      XDeleteProperty(_glfw.x11.display,(window->x11).handle);
    }
    if (_glfw.x11.NET_WM_STATE_FULLSCREEN == 0 || _glfw.x11.NET_WM_STATE == 0) {
      attributes.do_not_propagate_mask._0_4_ = 0;
      XChangeWindowAttributes(_glfw.x11.display,(window->x11).handle,0x200);
      (window->x11).overrideRedirect = 0;
    }
    else {
      sendEventToWM(window,_glfw.x11.NET_WM_STATE,0,_glfw.x11.NET_WM_STATE_FULLSCREEN,0,1,
                    in_stack_ffffffffffffff68);
    }
    XDeleteProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_BYPASS_COMPOSITOR);
  }
  else {
    if (_glfw.x11.NET_WM_FULLSCREEN_MONITORS != 0 && _glfw.x11.xinerama.available != 0) {
      a = (long)(window->monitor->x11).index;
      sendEventToWM(window,_glfw.x11.NET_WM_FULLSCREEN_MONITORS,a,a,a,a,in_stack_ffffffffffffff68);
    }
    if (_glfw.x11.NET_WM_STATE_FULLSCREEN == 0 || _glfw.x11.NET_WM_STATE == 0) {
      attributes.do_not_propagate_mask._0_4_ = 1;
      XChangeWindowAttributes(_glfw.x11.display,(window->x11).handle,0x200);
      (window->x11).overrideRedirect = 1;
    }
    else {
      sendEventToWM(window,_glfw.x11.NET_WM_STATE,1,_glfw.x11.NET_WM_STATE_FULLSCREEN,0,1,
                    in_stack_ffffffffffffff68);
    }
    local_90 = 1;
    XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_BYPASS_COMPOSITOR,6,0x20
                    ,0,&local_90,1);
  }
  return;
}

Assistant:

static void updateWindowMode(_GLFWwindow* window)
{
    if (window->monitor)
    {
        if (_glfw.x11.xinerama.available &&
            _glfw.x11.NET_WM_FULLSCREEN_MONITORS)
        {
            sendEventToWM(window,
                          _glfw.x11.NET_WM_FULLSCREEN_MONITORS,
                          window->monitor->x11.index,
                          window->monitor->x11.index,
                          window->monitor->x11.index,
                          window->monitor->x11.index,
                          0);
        }

        if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_FULLSCREEN)
        {
            sendEventToWM(window,
                          _glfw.x11.NET_WM_STATE,
                          _NET_WM_STATE_ADD,
                          _glfw.x11.NET_WM_STATE_FULLSCREEN,
                          0, 1, 0);
        }
        else
        {
            // This is the butcher's way of removing window decorations
            // Setting the override-redirect attribute on a window makes the
            // window manager ignore the window completely (ICCCM, section 4)
            // The good thing is that this makes undecorated full screen windows
            // easy to do; the bad thing is that we have to do everything
            // manually and some things (like iconify/restore) won't work at
            // all, as those are tasks usually performed by the window manager

            XSetWindowAttributes attributes;
            attributes.override_redirect = True;
            XChangeWindowAttributes(_glfw.x11.display,
                                    window->x11.handle,
                                    CWOverrideRedirect,
                                    &attributes);

            window->x11.overrideRedirect = GLFW_TRUE;
        }

        // Enable compositor bypass
        {
            const unsigned long value = 1;

            XChangeProperty(_glfw.x11.display,  window->x11.handle,
                            _glfw.x11.NET_WM_BYPASS_COMPOSITOR, XA_CARDINAL, 32,
                            PropModeReplace, (unsigned char*) &value, 1);
        }
    }
    else
    {
        if (_glfw.x11.xinerama.available &&
            _glfw.x11.NET_WM_FULLSCREEN_MONITORS)
        {
            XDeleteProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.NET_WM_FULLSCREEN_MONITORS);
        }

        if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_FULLSCREEN)
        {
            sendEventToWM(window,
                          _glfw.x11.NET_WM_STATE,
                          _NET_WM_STATE_REMOVE,
                          _glfw.x11.NET_WM_STATE_FULLSCREEN,
                          0, 1, 0);
        }
        else
        {
            XSetWindowAttributes attributes;
            attributes.override_redirect = False;
            XChangeWindowAttributes(_glfw.x11.display,
                                    window->x11.handle,
                                    CWOverrideRedirect,
                                    &attributes);

            window->x11.overrideRedirect = GLFW_FALSE;
        }

        // Disable compositor bypass
        {
            XDeleteProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.NET_WM_BYPASS_COMPOSITOR);
        }
    }
}